

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

void __thiscall cursespp::ShortcutsWindow::KeyPress(ShortcutsWindow *this)

{
  string *in_RSI;
  
  KeyPress((ShortcutsWindow *)&this[-1].super_Window.frame,in_RSI);
  return;
}

Assistant:

bool ShortcutsWindow::KeyPress(const std::string& key) {
    if (this->changedCallback && this->IsFocused()) {
        int count = (int) this->entries.size();
        if (count > 0) {
            auto& keys = NavigationKeys();

            if (keys.Right(key)) {
                int active = getActiveIndex();
                if (active >= 0 && active + 1 < count) {
                    this->activeKey = this->entries[active + 1]->key;
                }
                else {
                    this->activeKey = this->entries[0]->key;
                }
                this->Redraw();
                return true;
            }
            else if (keys.Left(key)) {
                int active = getActiveIndex();
                if (active > 0) {
                    this->activeKey = this->entries[active - 1]->key;
                }
                else {
                    this->activeKey = this->entries[count - 1]->key;
                }
                this->Redraw();
                return true;
            }
            else if (key == "KEY_ENTER") {
                /* replace the original key we cached when we were forcused originally
                to "commit" the operation, as it'll be swapped back when we lose focus */
                this->originalKey = this->activeKey;
                if (this->changedCallback) {
                    this->changedCallback(this->activeKey);
                }
                return true;
            }
        }
    }
    return false;
}